

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zm.c
# Opt level: O0

void zmDivMont2(word *b,word *divident,word *a,qr_o *r,void *stack)

{
  qr_o *in_RCX;
  qr_o *in_RDX;
  word *in_RSI;
  word *in_RDI;
  long in_R8;
  word *unaff_retaddr;
  word *c;
  
  zmInvMont2(in_RSI,(word *)in_RDX,in_RCX,(void *)(in_R8 + in_RCX->n * 8));
  zmMulMont2(unaff_retaddr,in_RDI,in_RSI,in_RDX,in_RCX);
  return;
}

Assistant:

static void zmDivMont2(word b[], const word divident[], const word a[],
	const qr_o* r, void* stack)
{
	word* c = (word*)stack;
	ASSERT(zmIsOperable(r));
	ASSERT(zmIsIn(divident, r));
	ASSERT(zmIsIn(a, r));
	stack = c + r->n;
	// c <- a^{(-1)} (в кольце Монтгомери)
	zmInvMont2(c, a, r, stack);
	// b <- divident * c
	zmMulMont2(b, divident, c, r, stack);
}